

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
uninitialized_move_n
          (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
           *this,size_type n,size_type i,size_type j,
          btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
          *x,allocator_type *alloc)

{
  template_ElementType<2UL> *ptVar1;
  template_ElementType<2UL> *ptVar2;
  long lVar3;
  
  btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
  GetField<2ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                 *)x);
  ptVar1 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
           GetField<2ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                          *)this);
  ptVar2 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
           GetField<2ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                          *)x);
  for (lVar3 = 0; n << 2 != lVar3; lVar3 = lVar3 + 4) {
    *(undefined4 *)((long)ptVar2 + lVar3 + j * 4) = *(undefined4 *)((long)ptVar1 + lVar3 + i * 4);
  }
  return;
}

Assistant:

void uninitialized_move_n(const size_type n, const size_type i,
                                  const size_type j, btree_node *x,
                                  allocator_type *alloc) {
            phmap::priv::SanitizerUnpoisonMemoryRegion(
                x->slot(j), n * sizeof(slot_type));
            for (slot_type *src = slot(i), *end = src + n, *dest = x->slot(j);
                 src != end; ++src, ++dest) {
                params_type::construct(alloc, dest, src);
            }
        }